

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O2

void __thiscall shared_ptr_empty_ptr_Test::TestBody(shared_ptr_empty_ptr_Test *this)

{
  long lVar1;
  undefined8 uVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  char *pcVar4;
  long in_FS_OFFSET;
  bool bVar5;
  AssertHelper local_90;
  AssertionResult gtest_ar_15;
  shared_ptr<Struct> local_78;
  AssertHelper local_60;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar;
  shared_ptr<Struct> xPtr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  xPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  xPtr.px = (Struct *)0x0;
  gtest_ar_8._0_8_ = gtest_ar_8._0_8_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
            ((internal *)&gtest_ar,"false","xPtr",&gtest_ar_8.success_,&xPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x32,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8._0_8_ = gtest_ar_8._0_8_ & 0xffffffffffffff00;
  if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)xPtr.super_shared_ptr_base.pn.pn == 1;
  }
  gtest_ar_15.success_ = bVar5;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"false","xPtr.unique()",&gtest_ar_8.success_,
             &gtest_ar_15.success_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x33,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_15._0_8_ = gtest_ar_15._0_8_ & 0xffffffff00000000;
  if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    gtest_ar_8.success_ = false;
    gtest_ar_8._1_7_ = 0;
  }
  else {
    gtest_ar_8._0_8_ = *(undefined8 *)xPtr.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0","xPtr.use_count()",(int *)&gtest_ar_15,(long *)&gtest_ar_8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x34,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = false;
  gtest_ar_8._1_7_ = 0;
  gtest_ar_15._0_8_ = xPtr.px;
  testing::internal::CmpHelperEQ<void*,Struct*>
            ((internal *)&gtest_ar,"(void*)__null","xPtr.get()",(void **)&gtest_ar_8,
             (Struct **)&gtest_ar_15);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x35,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) ||
     (*(long *)xPtr.super_shared_ptr_base.pn.pn < 1)) {
    shared_ptr<Struct>::release(&xPtr);
    gtest_ar_8._0_8_ = gtest_ar_8._0_8_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&gtest_ar,"false","xPtr",&gtest_ar_8.success_,&xPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x3f,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_8._0_8_ = gtest_ar_8._0_8_ & 0xffffffffffffff00;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = *(long *)xPtr.super_shared_ptr_base.pn.pn == 1;
    }
    gtest_ar_15.success_ = bVar5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"false","xPtr.unique()",&gtest_ar_8.success_,
               &gtest_ar_15.success_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x40,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_15._0_8_ = gtest_ar_15._0_8_ & 0xffffffff00000000;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      gtest_ar_8.success_ = false;
      gtest_ar_8._1_7_ = 0;
    }
    else {
      gtest_ar_8._0_8_ = *(undefined8 *)xPtr.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar,"0","xPtr.use_count()",(int *)&gtest_ar_15,(long *)&gtest_ar_8)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x41,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_8.success_ = false;
    gtest_ar_8._1_7_ = 0;
    gtest_ar_15._0_8_ = xPtr.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&gtest_ar,"(void*)__null","xPtr.get()",(void **)&gtest_ar_8,
               (Struct **)&gtest_ar_15);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x42,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    shared_ptr<Struct>::shared_ptr((shared_ptr<Struct> *)&gtest_ar,&xPtr);
    gtest_ar_15._0_8_ = gtest_ar_15._0_8_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&gtest_ar_8,"false","xPtr",&gtest_ar_15.success_,&xPtr);
    if (gtest_ar_8.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_15);
      if (gtest_ar_8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x49,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_15);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_15);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_8.message_);
    gtest_ar_15._0_8_ = gtest_ar_15._0_8_ & 0xffffffffffffff00;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = *(long *)xPtr.super_shared_ptr_base.pn.pn == 1;
    }
    local_60.data_._0_1_ = bVar5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar_8,"false","xPtr.unique()",&gtest_ar_15.success_,
               (bool *)&local_60);
    if (gtest_ar_8.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_15);
      if (gtest_ar_8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_15);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_15);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_8.message_);
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      gtest_ar_15.success_ = false;
      gtest_ar_15._1_7_ = 0;
    }
    else {
      gtest_ar_15._0_8_ = *(undefined8 *)xPtr.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_8,"0","xPtr.use_count()",(int *)&local_60,(long *)&gtest_ar_15)
    ;
    if (gtest_ar_8.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_15);
      if (gtest_ar_8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_15);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_15);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_8.message_);
    gtest_ar_15.success_ = false;
    gtest_ar_15._1_7_ = 0;
    local_60.data_ = (AssertHelperData *)xPtr.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&gtest_ar_8,"(void*)__null","xPtr.get()",(void **)&gtest_ar_15,
               (Struct **)&local_60);
    if (gtest_ar_8.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_15);
      if (gtest_ar_8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_15);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_15);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_8.message_);
    gtest_ar_15._0_8_ = gtest_ar_15._0_8_ & 0xffffffffffffff00;
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == (long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = *(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == 1;
    }
    local_60.data_._0_1_ = bVar5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar_8,"false","yPtr.unique()",&gtest_ar_15.success_,
               (bool *)&local_60);
    if (gtest_ar_8.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_15);
      if (gtest_ar_8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_15);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_15);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_8.message_);
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == (undefined8 *)0x0) {
      gtest_ar_15.success_ = false;
      gtest_ar_15._1_7_ = 0;
    }
    else {
      gtest_ar_15._0_8_ = *(undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_8,"0","yPtr.use_count()",(int *)&local_60,(long *)&gtest_ar_15)
    ;
    if (gtest_ar_8.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_15);
      if (gtest_ar_8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_15);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_15);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_8.message_);
    gtest_ar_15.success_ = false;
    gtest_ar_15._1_7_ = 0;
    local_60.data_ = (AssertHelperData *)gtest_ar.message_.ptr_;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&gtest_ar_8,"(void*)__null","yPtr.get()",(void **)&gtest_ar_15,
               (Struct **)&local_60);
    if (gtest_ar_8.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_15);
      if (gtest_ar_8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x4f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_15);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_15);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_8.message_);
    gtest_ar_8.success_ = false;
    gtest_ar_8._1_7_ = 0;
    gtest_ar_8.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    shared_ptr<Struct>::shared_ptr(&local_78,&xPtr);
    sVar3 = gtest_ar_8.message_;
    uVar2 = gtest_ar_8._0_8_;
    gtest_ar_8._0_8_ = local_78.super_shared_ptr_base.pn.pn;
    gtest_ar_8.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.px;
    local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)uVar2;
    local_78.px = (Struct *)sVar3.ptr_;
    shared_ptr<Struct>::release(&local_78);
    local_60.data_ = local_60.data_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&gtest_ar_15,"false","xPtr",(bool *)&local_60,&xPtr);
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x55,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    local_60.data_ = local_60.data_ & 0xffffffffffffff00;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = *(long *)xPtr.super_shared_ptr_base.pn.pn == 1;
    }
    local_90.data_._0_1_ = bVar5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar_15,"false","xPtr.unique()",(bool *)&local_60,(bool *)&local_90)
    ;
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x56,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    local_90.data_ = local_90.data_ & 0xffffffff00000000;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      local_60.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_60.data_ = *(AssertHelperData **)xPtr.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_15,"0","xPtr.use_count()",(int *)&local_90,(long *)&local_60);
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x57,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    local_60.data_ = (AssertHelperData *)0x0;
    local_90.data_ = (AssertHelperData *)xPtr.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&gtest_ar_15,"(void*)__null","xPtr.get()",&local_60.data_,
               (Struct **)&local_90);
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x58,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    local_60.data_ = local_60.data_ & 0xffffffffffffff00;
    if (gtest_ar_8._0_8_ == 0) {
      bVar5 = false;
    }
    else {
      bVar5 = *(long *)gtest_ar_8._0_8_ == 1;
    }
    local_90.data_._0_1_ = bVar5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar_15,"false","zPtr.unique()",(bool *)&local_60,(bool *)&local_90)
    ;
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x59,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    local_90.data_ = local_90.data_ & 0xffffffff00000000;
    if (gtest_ar_8._0_8_ == 0) {
      local_60.data_ = (AssertHelperData *)0x0;
    }
    else {
      local_60.data_ = *(AssertHelperData **)gtest_ar_8._0_8_;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_15,"0","zPtr.use_count()",(int *)&local_90,(long *)&local_60);
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    local_60.data_ = (AssertHelperData *)0x0;
    local_90.data_ = (AssertHelperData *)gtest_ar_8.message_.ptr_;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&gtest_ar_15,"(void*)__null","zPtr.get()",&local_60.data_,
               (Struct **)&local_90);
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    shared_ptr<Struct>::release((shared_ptr<Struct> *)&gtest_ar_8);
    shared_ptr<Struct>::release((shared_ptr<Struct> *)&gtest_ar);
    gtest_ar_8._0_8_ = gtest_ar_8._0_8_ & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
              ((internal *)&gtest_ar,"false","xPtr",&gtest_ar_8.success_,&xPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x5f,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_8._0_8_ = gtest_ar_8._0_8_ & 0xffffffffffffff00;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = *(long *)xPtr.super_shared_ptr_base.pn.pn == 1;
    }
    gtest_ar_15.success_ = bVar5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"false","xPtr.unique()",&gtest_ar_8.success_,
               &gtest_ar_15.success_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x60,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_15._0_8_ = gtest_ar_15._0_8_ & 0xffffffff00000000;
    if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
      gtest_ar_8.success_ = false;
      gtest_ar_8._1_7_ = 0;
    }
    else {
      gtest_ar_8._0_8_ = *(undefined8 *)xPtr.super_shared_ptr_base.pn.pn;
    }
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar,"0","xPtr.use_count()",(int *)&gtest_ar_15,(long *)&gtest_ar_8)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x61,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_8.success_ = false;
    gtest_ar_8._1_7_ = 0;
    gtest_ar_15._0_8_ = xPtr.px;
    testing::internal::CmpHelperEQ<void*,Struct*>
              ((internal *)&gtest_ar,"(void*)__null","xPtr.get()",(void **)&gtest_ar_8,
               (Struct **)&gtest_ar_15);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x62,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_15,(Message *)&gtest_ar_8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x39,"bool cast operator error");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  shared_ptr<Struct>::release(&xPtr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, empty_ptr)
{
    // Create an empty (ie. NULL) shared_ptr
    shared_ptr<Struct> xPtr;

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());

    if (xPtr)
    {
        GTEST_FATAL_FAILURE_("bool cast operator error");
    }

    // Reset to NULL (ie. do nothing)
    xPtr.reset();

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());

    // sub-scope
    {
        // Copy construct the empty (ie. NULL) shared_ptr
        shared_ptr<Struct> yPtr(xPtr);

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(0,     xPtr.use_count());
        EXPECT_EQ((void*)NULL,  xPtr.get());
        EXPECT_EQ(false, yPtr.unique());
        EXPECT_EQ(0,     yPtr.use_count());
        EXPECT_EQ((void*)NULL,  yPtr.get());

        // Assign the empty (ie. NULL) shared_ptr
        shared_ptr<Struct> zPtr;
        zPtr = xPtr;

        EXPECT_EQ(false, xPtr);
        EXPECT_EQ(false, xPtr.unique());
        EXPECT_EQ(0,     xPtr.use_count());
        EXPECT_EQ((void*)NULL,  xPtr.get());
        EXPECT_EQ(false, zPtr.unique());
        EXPECT_EQ(0,     zPtr.use_count());
        EXPECT_EQ((void*)NULL,  zPtr.get());
    }
    // end of scope

    EXPECT_EQ(false, xPtr);
    EXPECT_EQ(false, xPtr.unique());
    EXPECT_EQ(0,     xPtr.use_count());
    EXPECT_EQ((void*)NULL,  xPtr.get());
}